

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpsources.cpp
# Opt level: O2

void __thiscall
jrtplib::RTPSources::MultipleTimeouts
          (RTPSources *this,RTPTime *curtime,RTPTime *sendertimeout,RTPTime *byetimeout,
          RTPTime *generaltimeout,RTPTime *notetimeout)

{
  RTPTime *pRVar1;
  byte bVar2;
  bool bVar3;
  RTPInternalSourceData *this_00;
  HashElement *pHVar4;
  bool bVar5;
  bool bVar6;
  HashElement *pHVar7;
  int iVar8;
  byte bVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  int local_68;
  int local_64;
  
  dVar10 = curtime->m_t;
  dVar11 = dVar10 - sendertimeout->m_t;
  dVar12 = dVar10 - byetimeout->m_t;
  dVar13 = dVar10 - generaltimeout->m_t;
  dVar10 = dVar10 - notetimeout->m_t;
  pHVar7 = (this->sourcelist).firsthashelem;
  (this->sourcelist).curhashelem = pHVar7;
  iVar8 = 0;
  local_68 = 0;
  local_64 = 0;
  do {
    while( true ) {
      if (pHVar7 == (HashElement *)0x0) {
        this->totalcount = local_64;
        this->sendercount = local_68;
        this->activecount = iVar8;
        return;
      }
      this_00 = pHVar7->element;
      bVar2 = (this_00->super_RTPSourceData).receivedbye;
      bVar3 = (this_00->super_RTPSourceData).issender;
      bVar9 = (bVar2 ^ 1) & (this_00->super_RTPSourceData).validated;
      if (((this_00->super_RTPSourceData).SDESinf.nonprivateitems[6].length == 0) ||
         (pRVar1 = &(this_00->super_RTPSourceData).stats.lastnotetime,
         dVar10 < pRVar1->m_t || dVar10 == pRVar1->m_t)) {
        bVar5 = false;
      }
      else {
        RTPInternalSourceData::ClearNote(this_00);
        bVar2 = (this_00->super_RTPSourceData).receivedbye;
        bVar5 = true;
      }
      if ((((bVar2 & 1) == 0) || (this_00 == this->owndata)) ||
         (pRVar1 = &(this_00->super_RTPSourceData).byetime,
         dVar12 < pRVar1->m_t || dVar12 == pRVar1->m_t)) break;
      bVar6 = false;
      bVar5 = true;
LAB_00132e36:
      RTPKeyHashTable<const_unsigned_int,_jrtplib::RTPInternalSourceData_*,_jrtplib::RTPSources_GetHashIndex,_8317>
      ::DeleteCurrentElement(&this->sourcelist);
      if (bVar3 != false) {
        this->sendercount = this->sendercount + -1;
      }
      if (bVar9 != 0) {
        this->activecount = this->activecount + -1;
      }
      this->totalcount = this->totalcount + -1;
      if (bVar5) {
        (*(this->super_RTPMemoryObject)._vptr_RTPMemoryObject[9])(this,this_00);
      }
      if (bVar6) {
        (*(this->super_RTPMemoryObject)._vptr_RTPMemoryObject[8])(this,this_00);
      }
      (*(this->super_RTPMemoryObject)._vptr_RTPMemoryObject[7])(this,this_00);
      RTPDelete<jrtplib::RTPInternalSourceData>(this_00,(this->super_RTPMemoryObject).mgr);
      pHVar7 = (this->sourcelist).curhashelem;
    }
    if ((this_00 != this->owndata) &&
       (pRVar1 = &(this_00->super_RTPSourceData).stats.lastmsgtime,
       pRVar1->m_t <= dVar13 && dVar13 != pRVar1->m_t)) {
      bVar5 = false;
      bVar6 = true;
      goto LAB_00132e36;
    }
    if (bVar3 != false) {
      pRVar1 = &(this_00->super_RTPSourceData).stats.lastrtptime;
      if (dVar11 < pRVar1->m_t || dVar11 == pRVar1->m_t) {
        local_68 = local_68 + 1;
      }
      else {
        (this_00->super_RTPSourceData).issender = false;
        this->sendercount = this->sendercount + -1;
      }
    }
    if (bVar5) {
      (*(this->super_RTPMemoryObject)._vptr_RTPMemoryObject[0x12])(this,this_00);
    }
    local_64 = local_64 + 1;
    iVar8 = iVar8 + (uint)bVar9;
    pHVar4 = (this->sourcelist).curhashelem;
    pHVar7 = (HashElement *)0x0;
    if (pHVar4 != (HashElement *)0x0) {
      pHVar7 = pHVar4->listnext;
      (this->sourcelist).curhashelem = pHVar7;
    }
  } while( true );
}

Assistant:

void RTPSources::MultipleTimeouts(const RTPTime &curtime,const RTPTime &sendertimeout,const RTPTime &byetimeout,const RTPTime &generaltimeout,const RTPTime &notetimeout)
{
	int newtotalcount = 0;
	int newsendercount = 0;
	int newactivecount = 0;
	RTPTime senderchecktime = curtime;
	RTPTime byechecktime = curtime;
	RTPTime generaltchecktime = curtime;
	RTPTime notechecktime = curtime;
	senderchecktime -= sendertimeout;
	byechecktime -= byetimeout;
	generaltchecktime -= generaltimeout;
	notechecktime -= notetimeout;
	
	sourcelist.GotoFirstElement();
	while (sourcelist.HasCurrentElement())
	{
		RTPInternalSourceData *srcdat = sourcelist.GetCurrentElement();
		bool deleted,issender,isactive;
		bool byetimeout,normaltimeout,notetimeout;
		
		size_t notelen;
		
		issender = srcdat->IsSender();
		isactive = srcdat->IsActive();
		deleted = false;
		byetimeout = false;
		normaltimeout = false;
		notetimeout = false;

        	srcdat->SDES_GetNote(&notelen);
		if (notelen != 0) // Note has been set
		{
			RTPTime notetime = srcdat->INF_GetLastSDESNoteTime();
			
			if (notechecktime > notetime)
			{
				notetimeout = true;
				srcdat->ClearNote();
			}
		}

		if (srcdat->ReceivedBYE())
		{
			RTPTime byetime = srcdat->GetBYETime();

			if ((srcdat != owndata) && (byechecktime > byetime))
			{
				sourcelist.DeleteCurrentElement();
				deleted = true;
				byetimeout = true;
			}
		}

		if (!deleted)
		{
			RTPTime lastmsgtime = srcdat->INF_GetLastMessageTime();

			if ((srcdat != owndata) && (lastmsgtime < generaltchecktime))
			{
				sourcelist.DeleteCurrentElement();
				deleted = true;
				normaltimeout = true;
			}
		}
		
		if (!deleted)
		{
			newtotalcount++;
			
			if (issender)
			{
				RTPTime lastrtppacktime = srcdat->INF_GetLastRTPPacketTime();

				if (lastrtppacktime < senderchecktime)
				{
					srcdat->ClearSenderFlag();
					sendercount--;
				}
				else
					newsendercount++;
			}

			if (isactive)
				newactivecount++;

			if (notetimeout)
				OnNoteTimeout(srcdat);

			sourcelist.GotoNextElement();
		}
		else // deleted entry
		{
			if (issender)
				sendercount--;
			if (isactive)
				activecount--;
			totalcount--;

			if (byetimeout)
				OnBYETimeout(srcdat);
			if (normaltimeout)
				OnTimeout(srcdat);
			OnRemoveSource(srcdat);
			RTPDelete(srcdat,GetMemoryManager());
		}
	}	
	
#ifdef RTPDEBUG
	if (newtotalcount != totalcount)
	{
		SafeCountTotal();
		std::cout << "New total count " << newtotalcount << " doesnt match old total count " << totalcount << std::endl;
	}
	if (newsendercount != sendercount)
	{
		SafeCountSenders();
		std::cout << "New sender count " << newsendercount << " doesnt match old sender count " << sendercount << std::endl;
	}
	if (newactivecount != activecount)
	{
		std::cout << "New active count " << newactivecount << " doesnt match old active count " << activecount << std::endl;
		SafeCountActive();
	}
#endif // RTPDEBUG
	
	totalcount = newtotalcount; // just to play it safe
	sendercount = newsendercount;
	activecount = newactivecount;
}